

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O2

InsertOrderedSet<wasm::Name> * __thiscall
wasm::InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>::operator[]
          (InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *this,Name *k)

{
  char **this_00;
  pair<std::_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>,_bool>
  pVar1;
  undefined1 auStack_c8 [8];
  pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> kv;
  undefined8 uStack_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  
  kv.second.List.super__List_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl._M_node._M_size =
       (size_t)&stack0xffffffffffffffc8;
  uStack_38 = 0;
  local_30 = (undefined1 *)&stack0xffffffffffffffd0;
  local_20 = 0;
  auStack_c8 = (undefined1  [8])(k->super_IString).str._M_len;
  kv.first.super_IString.str._M_len = (size_t)(k->super_IString).str._M_str;
  this_00 = &kv.first.super_IString.str._M_str;
  local_28 = local_30;
  InsertOrderedSet<wasm::Name>::InsertOrderedSet
            ((InsertOrderedSet<wasm::Name> *)this_00,
             (InsertOrderedSet<wasm::Name> *)
             &kv.second.List.super__List_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              _M_node._M_size);
  InsertOrderedSet<wasm::Name>::~InsertOrderedSet
            ((InsertOrderedSet<wasm::Name> *)
             &kv.second.List.super__List_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              _M_node._M_size);
  pVar1 = insert(this,(pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *)auStack_c8);
  InsertOrderedSet<wasm::Name>::~InsertOrderedSet((InsertOrderedSet<wasm::Name> *)this_00);
  return (InsertOrderedSet<wasm::Name> *)(pVar1.first._M_node._M_node + 2);
}

Assistant:

T& operator[](const Key& k) {
    std::pair<const Key, T> kv = {k, {}};
    return insert(kv).first->second;
  }